

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O0

Bool Bezier_Up(black_PWorker worker,Int degree,TPoint *arc,TSplitter splitter,Long miny,Long maxy)

{
  long lVar1;
  long lVar2;
  bool local_81;
  long *local_80;
  PLong top;
  TPoint *start_arc;
  ulong uStack_68;
  Short f1;
  Long e0;
  Long e2;
  Long e;
  Long y2;
  Long y1;
  Long maxy_local;
  Long miny_local;
  TSplitter splitter_local;
  TPoint *arc_local;
  Int degree_local;
  black_PWorker worker_local;
  
  lVar2 = arc[degree].y;
  local_80 = worker->top;
  if ((miny <= arc->y) && (lVar2 <= maxy)) {
    e0 = arc->y & (long)-worker->precision;
    if (maxy < e0) {
      e0 = maxy;
    }
    uStack_68 = miny;
    e2 = miny;
    if ((miny <= lVar2) &&
       (uStack_68 = (lVar2 + worker->precision) - 1U & (long)-worker->precision, e2 = uStack_68,
       (ushort)((ushort)lVar2 & (short)worker->precision - 1U) == 0)) {
      if (worker->joint != '\0') {
        local_80 = local_80 + -1;
        worker->joint = '\0';
      }
      *local_80 = arc[degree].x;
      e2 = (long)worker->precision + uStack_68;
      local_80 = local_80 + 1;
    }
    if (worker->fresh != '\0') {
      worker->cProfile->start = (long)uStack_68 >> ((byte)worker->precision_bits & 0x3f);
      worker->fresh = '\0';
    }
    if (e2 <= e0) {
      splitter_local = (TSplitter)arc;
      if (worker->maxBuff <= local_80 + (e0 - e2 >> ((byte)worker->precision_bits & 0x3f)) + 1) {
        worker->top = local_80;
        worker->error = 0x62;
        return '\x01';
      }
      do {
        worker->joint = '\0';
        lVar2 = *(long *)(splitter_local + 8);
        if (e2 < lVar2) {
          lVar1 = *(long *)(splitter_local + (long)degree * 0x10 + 8);
          if (lVar2 - lVar1 < (long)worker->precision_step) {
            *local_80 = *(long *)(splitter_local + (long)degree * 0x10) +
                        ((*(long *)splitter_local - *(long *)(splitter_local + (long)degree * 0x10))
                        * (e2 - lVar1)) / (lVar2 - lVar1);
            lVar2 = (long)degree * -0x10;
            e2 = worker->precision + e2;
            local_80 = local_80 + 1;
          }
          else {
            (*splitter)((TPoint *)splitter_local);
            lVar2 = (long)degree * 0x10;
          }
        }
        else {
          if (lVar2 == e2) {
            worker->joint = '\x01';
            *local_80 = *(long *)splitter_local;
            e2 = worker->precision + e2;
            local_80 = local_80 + 1;
          }
          lVar2 = (long)degree * -0x10;
        }
        splitter_local = splitter_local + lVar2;
        local_81 = arc <= splitter_local && e2 <= e0;
      } while (local_81);
    }
  }
  worker->top = local_80;
  return '\0';
}

Assistant:

static Bool
  Bezier_Up( RAS_ARGS Int        degree,
                      TPoint*    arc,
                      TSplitter  splitter,
                      Long       miny,
                      Long       maxy )
  {
    Long   y1, y2, e, e2, e0;
    Short  f1;

    TPoint*  start_arc;

    PLong top;


    y1  = arc[degree].y;
    y2  = arc[0].y;
    top = ras.top;

    if ( y2 < miny || y1 > maxy )
      goto Fin;

    e2 = FLOOR( y2 );

    if ( e2 > maxy )
      e2 = maxy;

    e0 = miny;

    if ( y1 < miny )
      e = miny;
    else
    {
      e  = CEILING( y1 );
      f1 = (Short)( FRAC( y1 ) );
      e0 = e;

      if ( f1 == 0 )
      {
        if ( ras.joint )
        {
          top--;
          ras.joint = FALSE;
        }

        *top++ = arc[degree].x;

        e += ras.precision;
      }
    }

    if ( ras.fresh )
    {
      ras.cProfile->start = TRUNC( e0 );
      ras.fresh = FALSE;
    }

    if ( e2 < e )
      goto Fin;

    if ( ( top + TRUNC( e2 - e ) + 1 ) >= ras.maxBuff )
    {
      ras.top   = top;
      ras.error = FT_THROW( Raster_Overflow );
      return FAILURE;
    }

    start_arc = arc;

    do
    {
      ras.joint = FALSE;

      y2 = arc[0].y;

      if ( y2 > e )
      {
        y1 = arc[degree].y;
        if ( y2 - y1 >= ras.precision_step )
        {
          splitter( arc );
          arc += degree;
        }
        else
        {
          *top++ = arc[degree].x + FMulDiv( arc[0].x - arc[degree].x,
                                            e - y1, y2 - y1 );
          arc -= degree;
          e   += ras.precision;
        }
      }
      else
      {
        if ( y2 == e )
        {
          ras.joint  = TRUE;
          *top++     = arc[0].x;

          e += ras.precision;
        }
        arc -= degree;
      }
    } while ( arc >= start_arc && e <= e2 );

  Fin:
    ras.top  = top;
    return SUCCESS;
  }